

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

char * MipsFCCToString(Mips_CondCode CC)

{
  char *pcStack_10;
  Mips_CondCode CC_local;
  
  switch(CC) {
  case Mips_FCOND_F:
  case Mips_FCOND_T:
    pcStack_10 = "f";
    break;
  case Mips_FCOND_UN:
  case Mips_FCOND_OR:
    pcStack_10 = "un";
    break;
  case Mips_FCOND_OEQ:
  case Mips_FCOND_UNE:
    pcStack_10 = "eq";
    break;
  case Mips_FCOND_UEQ:
  case Mips_FCOND_ONE:
    pcStack_10 = "ueq";
    break;
  case Mips_FCOND_OLT:
  case Mips_FCOND_UGE:
    pcStack_10 = "olt";
    break;
  case Mips_FCOND_ULT:
  case Mips_FCOND_OGE:
    pcStack_10 = "ult";
    break;
  case Mips_FCOND_OLE:
  case Mips_FCOND_UGT:
    pcStack_10 = "ole";
    break;
  case Mips_FCOND_ULE:
  case Mips_FCOND_OGT:
    pcStack_10 = "ule";
    break;
  case Mips_FCOND_SF:
  case Mips_FCOND_ST:
    pcStack_10 = "sf";
    break;
  case Mips_FCOND_NGLE:
  case Mips_FCOND_GLE:
    pcStack_10 = "ngle";
    break;
  case Mips_FCOND_SEQ:
  case Mips_FCOND_SNE:
    pcStack_10 = "seq";
    break;
  case Mips_FCOND_NGL:
  case Mips_FCOND_GL:
    pcStack_10 = "ngl";
    break;
  case Mips_FCOND_LT:
  case Mips_FCOND_NLT:
    pcStack_10 = "lt";
    break;
  case Mips_FCOND_NGE:
  case Mips_FCOND_GE:
    pcStack_10 = "nge";
    break;
  case Mips_FCOND_LE:
  case Mips_FCOND_NLE:
    pcStack_10 = "le";
    break;
  case Mips_FCOND_NGT:
  case Mips_FCOND_GT:
    pcStack_10 = "ngt";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static char* MipsFCCToString(Mips_CondCode CC)
{
	switch (CC) {
		default: return 0;	// never reach
		case Mips_FCOND_F:
		case Mips_FCOND_T:   return "f";
		case Mips_FCOND_UN:
		case Mips_FCOND_OR:  return "un";
		case Mips_FCOND_OEQ:
		case Mips_FCOND_UNE: return "eq";
		case Mips_FCOND_UEQ:
		case Mips_FCOND_ONE: return "ueq";
		case Mips_FCOND_OLT:
		case Mips_FCOND_UGE: return "olt";
		case Mips_FCOND_ULT:
		case Mips_FCOND_OGE: return "ult";
		case Mips_FCOND_OLE:
		case Mips_FCOND_UGT: return "ole";
		case Mips_FCOND_ULE:
		case Mips_FCOND_OGT: return "ule";
		case Mips_FCOND_SF:
		case Mips_FCOND_ST:  return "sf";
		case Mips_FCOND_NGLE:
		case Mips_FCOND_GLE: return "ngle";
		case Mips_FCOND_SEQ:
		case Mips_FCOND_SNE: return "seq";
		case Mips_FCOND_NGL:
		case Mips_FCOND_GL:  return "ngl";
		case Mips_FCOND_LT:
		case Mips_FCOND_NLT: return "lt";
		case Mips_FCOND_NGE:
		case Mips_FCOND_GE:  return "nge";
		case Mips_FCOND_LE:
		case Mips_FCOND_NLE: return "le";
		case Mips_FCOND_NGT:
		case Mips_FCOND_GT:  return "ngt";
	}
}